

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::MaybeIgnoreError(DBImpl *this,Status *s)

{
  Logger *info_log;
  bool bVar1;
  undefined8 uVar2;
  Status local_50 [3];
  Status local_38 [4];
  Status *local_18;
  Status *s_local;
  DBImpl *this_local;
  
  local_18 = s;
  s_local = (Status *)this;
  bVar1 = Status::ok(s);
  if ((!bVar1) && (((this->options_).paranoid_checks & 1U) == 0)) {
    info_log = (this->options_).info_log;
    Status::ToString_abi_cxx11_(local_38);
    uVar2 = std::__cxx11::string::c_str();
    Log(info_log,"Ignoring error %s",uVar2);
    std::__cxx11::string::~string((string *)local_38);
    Status::OK();
    Status::operator=(local_18,local_50);
    Status::~Status(local_50);
  }
  return;
}

Assistant:

void DBImpl::MaybeIgnoreError(Status* s) const {
  if (s->ok() || options_.paranoid_checks) {
    // No change needed
  } else {
    Log(options_.info_log, "Ignoring error %s", s->ToString().c_str());
    *s = Status::OK();
  }
}